

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckIfInTargetLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  AActor *this;
  double dVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  VMValue *pVVar9;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar10;
  char *pcVar11;
  uint uVar12;
  AActor *other;
  bool bVar13;
  double dVar14;
  _func_int **local_38;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
LAB_003d73db:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x111e,
                  "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d73db;
  }
  this = *(AActor **)&param->field_0;
  if (this != (AActor *)0x0) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
    }
    pPVar8 = (this->super_DThinker).super_DObject.Class;
    bVar13 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar5 && bVar13) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar13 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar5) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar13) {
      pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d73db;
    }
  }
  if (numparam == 1) {
    pVVar9 = defaultparam->Array;
    if (defaultparam->Array[1].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d7419:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x111f,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    pVVar9 = param;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d7419;
    }
  }
  dVar14 = pVVar9[1].field_0.f;
  if (numparam < 3) {
    pVVar9 = defaultparam->Array;
    if (pVVar9[2].field_0.field_3.Type != '\0') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d7438;
    }
  }
  else {
    pVVar9 = param;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar11 = "(param[paramnum]).Type == REGT_INT";
LAB_003d7438:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1120,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  uVar3 = pVVar9[2].field_0.i;
  if (numparam < 4) {
    pVVar9 = defaultparam->Array;
    if (pVVar9[3].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d7457;
    }
  }
  else {
    pVVar9 = param;
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d7457:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1121,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar1 = pVVar9[3].field_0.f;
  if (numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar11 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d7476;
    }
  }
  else if (param[4].field_0.field_3.Type != '\x01') {
    pcVar11 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d7476:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1122,
                  "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  dVar2 = param[4].field_0.f;
  if ((uVar3 & 0x40) == 0) {
    if ((((this->flags).Value & 0x10000) == 0) || ((uVar3 & 1) == 0)) {
      other = (this->target).field_0.p;
      if ((other != (AActor *)0x0) &&
         (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        paVar10 = &(this->target).field_0;
        goto LAB_003d711d;
      }
    }
    else {
      if (((this->flags2).Value & 0x40000000) == 0) goto LAB_003d7124;
      other = (this->tracer).field_0.p;
      if ((other != (AActor *)0x0) &&
         (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        paVar10 = &(this->tracer).field_0;
        goto LAB_003d711d;
      }
    }
  }
  else {
    other = (this->master).field_0.p;
    if ((other != (AActor *)0x0) &&
       (((other->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      paVar10 = &(this->master).field_0;
LAB_003d711d:
      paVar10->p = (AActor *)0x0;
LAB_003d7124:
      other = (AActor *)0x0;
    }
  }
  if (other == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1138,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else if (((uVar3 & 0x20) == 0) || (0 < other->health)) {
    dVar4 = AActor::Distance3D(this,other,false);
    if (((dVar1 == 0.0) && (!NAN(dVar1))) || (dVar4 <= dVar1)) {
      uVar12 = uVar3 & 2;
      if (((dVar2 != 0.0) || (NAN(dVar2))) && (dVar4 < dVar2)) {
        if ((uVar3 & 0x10) != 0) {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x114d,
                          "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          goto LAB_003d7398;
        }
        if ((uVar3 & 4) != 0) {
          dVar14 = 0.0;
        }
        uVar12 = uVar3 & 10;
      }
      if ((0.0 < dVar14) && (dVar14 < 360.0)) {
        iVar6 = 0;
        AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,other,SUB81(this,0));
        dVar1 = ABS((double)SUB84(((double)local_38 - (other->Angles).Yaw.Degrees) *
                                  11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08
                   );
        if ((dVar14 * 0.5 < dVar1) && (0 < numret)) {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x115c,
                          "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (ret->RegType != '\0') goto LAB_003d73f3;
          *(undefined4 *)ret->Location = 0;
          iVar6 = 1;
        }
        if (dVar14 * 0.5 < dVar1) {
          return iVar6;
        }
      }
      if ((uVar12 != 0) || (bVar13 = P_CheckSight(other,this,1), bVar13)) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1163,
                        "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        uVar7 = 1;
        if (ret->RegType != '\0') goto LAB_003d73f3;
        goto LAB_003d73a0;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1161,
                      "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1144,
                      "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
  }
  else {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x113d,
                    "int AF_AActor_CheckIfInTargetLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
LAB_003d7398:
  if (ret->RegType != '\0') {
LAB_003d73f3:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  uVar7 = 0;
LAB_003d73a0:
  *(undefined4 *)ret->Location = uVar7;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfInTargetLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target;

	if (flags & JLOSF_CHECKMASTER)
	{
		target = self->master;
	}
	else if (self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE))
	{
		if (self->flags2 & MF2_SEEKERMISSILE)
			target = self->tracer;
		else
			target = NULL;
	}
	else
	{
		target = self->target;
	}

	if (target == NULL)
	{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
		ACTION_RETURN_BOOL(false);
	}

	if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
	{
		ACTION_RETURN_BOOL(false);
	}

	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}

	bool doCheckSight = !(flags & JLOSF_NOSIGHT);

	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (fov > 0 && (fov < 360.))
	{
		DAngle an = absangle(target->AngleTo(self), target->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	if (doCheckSight && !P_CheckSight (target, self, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}